

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu_move_instructions.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_15662d::CpuMoveTest::move_test_clears_n
          (CpuMoveTest *this,uint8_t *expected_dest,uint8_t *expected_from,uint8_t *registers_from)

{
  bool bVar1;
  char *message;
  AssertHelper local_58 [3];
  Message local_40;
  undefined1 local_38 [8];
  AssertionResult gtest_ar;
  uint8_t *registers_from_local;
  uint8_t *expected_from_local;
  uint8_t *expected_dest_local;
  CpuMoveTest *this_local;
  
  *registers_from = '\x05';
  *expected_from = '\x05';
  *expected_dest = '\x05';
  (this->super_CpuTest).registers.p = (this->super_CpuTest).registers.p | 0x80;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )registers_from;
  n_e_s::core::test::CpuTest::step_execution(&this->super_CpuTest,'\x02');
  testing::internal::EqHelper::
  Compare<n_e_s::core::CpuRegisters,_n_e_s::core::CpuRegisters,_nullptr>
            ((EqHelper *)local_38,"expected","registers",&(this->super_CpuTest).expected,
             &(this->super_CpuTest).registers);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    testing::Message::Message(&local_40);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_38);
    testing::internal::AssertHelper::AssertHelper
              (local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu_move_instructions.cpp"
               ,0x2a,message);
    testing::internal::AssertHelper::operator=(local_58,&local_40);
    testing::internal::AssertHelper::~AssertHelper(local_58);
    testing::Message::~Message(&local_40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  return;
}

Assistant:

void move_test_clears_n(uint8_t *expected_dest,
            uint8_t *expected_from,
            uint8_t *registers_from) {
        *expected_from = *registers_from = 5;
        *expected_dest = 5;
        registers.p |= N_FLAG;

        step_execution(2);
        EXPECT_EQ(expected, registers);
    }